

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::BufferTest(BufferTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"textures_buffer","Texture Buffer Objects Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020f1f28;
  this->m_fbo = 0;
  this->m_rbo = 0;
  this->m_po = 0;
  this->m_to = 0;
  this->m_bo = 0;
  this->m_vao = 0;
  return;
}

Assistant:

BufferTest::BufferTest(deqp::Context& context)
	: deqp::TestCase(context, "textures_buffer", "Texture Buffer Objects Test")
	, m_fbo(0)
	, m_rbo(0)
	, m_po(0)
	, m_to(0)
	, m_bo(0)
	, m_vao(0)
{
	/* Intentionally left blank. */
}